

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void GiveInventory(AActor *activator,char *type,int amount)

{
  bool bVar1;
  int iVar2;
  PClassActor *this;
  int local_2c;
  int i;
  PClassActor *info;
  char *pcStack_18;
  int amount_local;
  char *type_local;
  AActor *activator_local;
  
  if ((0 < amount) && (type != (char *)0x0)) {
    iVar2 = strcasecmp(type,"Armor");
    pcStack_18 = type;
    if (iVar2 == 0) {
      pcStack_18 = "BasicArmorPickup";
    }
    this = PClass::FindActor(pcStack_18);
    if (this == (PClassActor *)0x0) {
      Printf("ACS: I don\'t know what %s is.\n",pcStack_18);
    }
    else {
      bVar1 = PClass::IsDescendantOf(&this->super_PClass,AInventory::RegistrationInfo.MyClass);
      if (bVar1) {
        if (activator == (AActor *)0x0) {
          for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
            if ((playeringame[local_2c] & 1U) != 0) {
              (**(code **)(*(long *)(&players)[(long)local_2c * 0x54] + 0xd0))
                        ((long *)(&players)[(long)local_2c * 0x54],this,amount,0);
            }
          }
        }
        else {
          (*(activator->super_DThinker).super_DObject._vptr_DObject[0x1a])
                    (activator,this,(ulong)(uint)amount,0);
        }
      }
      else {
        Printf("ACS: %s is not an inventory item.\n",pcStack_18);
      }
    }
  }
  return;
}

Assistant:

static void GiveInventory (AActor *activator, const char *type, int amount)
{
	PClassActor *info;

	if (amount <= 0 || type == NULL)
	{
		return;
	}
	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	info = PClass::FindActor(type);
	if (info == NULL)
	{
		Printf ("ACS: I don't know what %s is.\n", type);
	}
	else if (!info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		Printf ("ACS: %s is not an inventory item.\n", type);
	}
	else if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->GiveInventory(static_cast<PClassInventory *>(info), amount);
		}
	}
	else
	{
		activator->GiveInventory(static_cast<PClassInventory *>(info), amount);
	}
}